

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

void ghc::filesystem::current_path(path *p,error_code *ec)

{
  int iVar1;
  char *__path;
  error_code eVar2;
  undefined4 uStack_44;
  string local_38;
  error_code *local_18;
  error_code *ec_local;
  path *p_local;
  
  local_18 = ec;
  ec_local = (error_code *)p;
  std::error_code::clear(ec);
  path::string_abi_cxx11_(&local_38,(path *)ec_local);
  __path = (char *)std::__cxx11::string::c_str();
  iVar1 = chdir(__path);
  std::__cxx11::string::~string((string *)&local_38);
  if (iVar1 == -1) {
    eVar2 = detail::make_system_error(0);
    *(ulong *)local_18 = CONCAT44(uStack_44,eVar2._M_value);
    local_18->_M_cat = eVar2._M_cat;
  }
  return;
}

Assistant:

GHC_INLINE void current_path(const path& p, std::error_code& ec) noexcept
{
    ec.clear();
#ifdef GHC_OS_WINDOWS
    if (!::SetCurrentDirectoryW(detail::fromUtf8<std::wstring>(p.u8string()).c_str())) {
        ec = detail::make_system_error();
    }
#else
    if (::chdir(p.string().c_str()) == -1) {
        ec = detail::make_system_error();
    }
#endif
}